

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

void __thiscall
Disa::Matrix_Sparse::Matrix_Sparse
          (Matrix_Sparse *this,initializer_list<unsigned_long> non_zero,
          initializer_list<unsigned_long> index,initializer_list<double> value,size_t column)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  pointer puVar1;
  pointer pdVar2;
  __impl *p_Var3;
  pointer __last_00;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  unsigned_long uVar9;
  source_location *location;
  string *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  long lVar10;
  size_type __new_size;
  size_type sVar11;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp_02;
  ulong local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> org_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<double,_std::allocator<double>_> new_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<double,_std::allocator<double>_> *local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  string local_98;
  string local_78;
  string local_58;
  undefined **local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->row_non_zero,non_zero,(allocator_type *)&local_1c8);
  local_a0 = &this->column_index;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_a0,index,(allocator_type *)&local_1c8);
  local_a8 = &this->element_value;
  __a = &local_1c8;
  std::vector<double,_std::allocator<double>_>::vector(local_a8,value,(allocator_type *)__a);
  this->column_size = column;
  _Var7._M_current =
       (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if (*_Var7._M_current == 0) {
    __last._M_current =
         (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__last._M_current[-1] !=
        (long)(this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"\n");
      local_1a8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00150c28;
      console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_1a8,(source_location *)__a)
      ;
      poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
      poVar8 = std::operator<<(poVar8,
                               "Number of non-zeros does not match number of column non zeros");
      std::endl<char,std::char_traits<char>>(poVar8);
      goto LAB_0012e74e;
    }
    bVar4 = std::
            is_sorted<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (_Var7,__last);
    if (!bVar4) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"\n");
      local_1a8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00150c40;
      console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_1a8,(source_location *)__a)
      ;
      poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
      poVar8 = std::operator<<(poVar8,"Inconsistent non-zeros list, but be ascending.");
      std::endl<char,std::char_traits<char>>(poVar8);
      goto LAB_0012e74e;
    }
    if ((long)(this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == value._M_len) {
      new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d0 = 0;
      while( true ) {
        puVar1 = (this->row_non_zero).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((long)(this->row_non_zero).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1 >> 3) - 1U <= local_1d0) {
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&new_value.super__Vector_base<double,_std::allocator<double>_>);
          return;
        }
        __new_size = puVar1[local_1d0 + 1] - puVar1[local_1d0];
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&org_index,__new_size);
        std::vector<double,_std::allocator<double>_>::resize(&new_value,__new_size);
        __last_00 = org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        puVar1 = org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar9 = 0;
        for (lVar5 = 0;
            (pointer)((long)org_index.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar5) !=
            org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; lVar5 = lVar5 + 8) {
          org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = uVar9;
          uVar9 = uVar9 + 1;
        }
        if (org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar10 = (long)org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = lVar10 >> 3;
          lVar5 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          __comp_00._M_comp.row = &local_1d0;
          __comp_00._M_comp.this = this;
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                     (ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
          if (lVar10 < 0x81) {
            __comp_02._M_comp.row = &local_1d0;
            __comp_02._M_comp.this = this;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )puVar1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 )__last_00,__comp_02);
          }
          else {
            _Var7._M_current = puVar1 + 0x10;
            __comp_01._M_comp.row = &local_1d0;
            __comp_01._M_comp.this = this;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )puVar1,_Var7,__comp_01);
            for (; _Var7._M_current != __last_00; _Var7._M_current = _Var7._M_current + 1) {
              __comp._M_comp.row = &local_1d0;
              __comp._M_comp.this = this;
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Val_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                        (_Var7,__comp);
            }
          }
        }
        puVar1 = (this->row_non_zero).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        location = (source_location *)
                   (this->column_index).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pdVar2 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (sVar11 = 0; __new_size != sVar11; sVar11 = sVar11 + 1) {
          lVar5 = org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[sVar11] + puVar1[local_1d0];
          new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[sVar11] = pdVar2[lVar5];
          p_Var3 = location[lVar5]._M_impl;
          org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[sVar11] = (unsigned_long)p_Var3;
          if ((__impl *)this->column_size <= p_Var3) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"\n");
            local_38 = &PTR_s__workspace_llm4binary_github_lic_00150c70;
            console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_38,location);
            poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
            std::__cxx11::to_string
                      (&local_98,
                       org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[sVar11]);
            std::operator+(&local_c8,"Column index, ",&local_98);
            std::operator+(&local_108,&local_c8,", in row ");
            std::__cxx11::to_string(&local_58,local_1d0);
            std::operator+(&local_128,&local_108,&local_58);
            std::operator+(&local_168,&local_128," not in range");
            range_column_abi_cxx11_(&local_78,this);
            std::operator+(&local_148,&local_168,&local_78);
            std::operator+(&local_1a8,&local_148,".");
            poVar8 = std::operator<<(poVar8,(string *)&local_1a8);
            std::endl<char,std::char_traits<char>>(poVar8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)&local_58);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)&local_c8);
            this_00 = &local_98;
            goto LAB_0012e698;
          }
        }
        _Var7 = std::
                __adjacent_find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (org_index.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           org_index.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
        if (_Var7._M_current !=
            org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                   new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                   new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                   ((this->element_value).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start +
                   (this->row_non_zero).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[local_1d0]));
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )((this->column_index).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start +
                     (this->row_non_zero).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[local_1d0]));
        local_1d0 = local_1d0 + 1;
      }
      poVar8 = std::operator<<((ostream *)&std::cerr,"\n");
      local_98._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00150c88;
      console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_98,location);
      poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
      std::__cxx11::to_string(&local_108,this->column_size);
      std::operator+(&local_128,"Duplicate column index, ",&local_108);
      std::operator+(&local_168,&local_128,"in row ");
      std::__cxx11::to_string(&local_c8,local_1d0);
      std::operator+(&local_148,&local_168,&local_c8);
      std::operator+(&local_1a8,&local_148,".");
      poVar8 = std::operator<<(poVar8,(string *)&local_1a8);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_128);
      this_00 = &local_108;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"\n");
      local_c8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00150c58;
      console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_c8,(source_location *)__a);
      poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
      std::__cxx11::to_string
                (&local_128,
                 (long)(this->column_index).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->column_index).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_168,"Mis-match in column and value size, ",&local_128);
      std::operator+(&local_148,&local_168," vs. ");
      std::__cxx11::to_string(&local_108,value._M_len);
      std::operator+(&local_1a8,&local_148,&local_108);
      poVar8 = std::operator<<(poVar8,(string *)&local_1a8);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      this_00 = &local_128;
    }
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cerr,"\n");
    local_128._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_00150c10;
    console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_128,(source_location *)__a);
    poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
    std::__cxx11::to_string
              (&local_168,
               *(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start);
    std::operator+(&local_148,"First value must be zero, but is ",&local_168);
    std::operator+(&local_1a8,&local_148,".");
    poVar8 = std::operator<<(poVar8,(string *)&local_1a8);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_148);
    this_00 = &local_168;
  }
LAB_0012e698:
  std::__cxx11::string::~string((string *)this_00);
LAB_0012e74e:
  std::__cxx11::string::~string((string *)&local_1c8);
  exit(1);
}

Assistant:

Matrix_Sparse::Matrix_Sparse(std::initializer_list<std::size_t> non_zero, std::initializer_list<std::size_t> index,
                             std::initializer_list<double> value, std::size_t column)
    : row_non_zero(non_zero), column_index(index), element_value(value), column_size(column) {
  ASSERT(row_non_zero.front() == 0, "First value must be zero, but is " + std::to_string(row_non_zero.front()) + ".");
  ASSERT(row_non_zero.back() == column_index.size(), "Number of non-zeros does not match number of column non zeros");
  ASSERT(std::is_sorted(row_non_zero.begin(), row_non_zero.end()), "Inconsistent non-zeros list, but be ascending.");
  ASSERT(column_index.size() == value.size(), "Mis-match in column and value size, " +
                                              std::to_string(column_index.size()) + " vs. " +
                                              std::to_string(value.size()));

  std::vector<double> new_value;
  std::vector<std::size_t> org_index;
  FOR(row, row_non_zero.size() - 1) {
    const std::size_t size_non_zero = row_non_zero[row + 1] - row_non_zero[row];
    org_index.resize(size_non_zero);
    new_value.resize(size_non_zero);
    std::iota(org_index.begin(), org_index.end(), 0);
    std::sort(org_index.begin(), org_index.end(), [&](const std::size_t index_0, const std::size_t index_1) {
      return column_index[row_non_zero[row] + index_0] < column_index[row_non_zero[row] + index_1];
    });

    FOR(i_non_zero, size_non_zero) {
      new_value[i_non_zero] = element_value[row_non_zero[row] + org_index[i_non_zero]];
      org_index[i_non_zero] = column_index[row_non_zero[row] + org_index[i_non_zero]];
      ASSERT(org_index[i_non_zero] < column_size, "Column index, " + std::to_string(org_index[i_non_zero]) +
                                                  ", in row " + std::to_string(row) + " not in range" + range_column() +
                                                  ".");
    }
    ASSERT(std::adjacent_find(org_index.begin(), org_index.end()) == org_index.end(),
           "Duplicate column index, " + std::to_string(column_size) + "in row " + std::to_string(row) + ".");
    std::swap_ranges(new_value.begin(), new_value.end(),
                     std::next(element_value.begin(), static_cast<s_size_t>(row_non_zero[row])));
    std::swap_ranges(org_index.begin(), org_index.end(),
                     std::next(column_index.begin(), static_cast<s_size_t>(row_non_zero[row])));
  }
}